

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall choc::value::Value::Value(Value *this,Value *other)

{
  uchar *d;
  Value *other_local;
  Value *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->packedData,&other->packedData);
  SimpleStringDictionary::SimpleStringDictionary(&this->dictionary,&other->dictionary);
  d = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->packedData);
  ValueView::ValueView
            (&this->value,&(other->value).type,d,&(this->dictionary).super_StringDictionary);
  return;
}

Assistant:

inline Value::Value (const Value& other)
   : packedData (other.packedData), dictionary (other.dictionary),
     value (other.value.type, packedData.data(), std::addressof (dictionary))
{
}